

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O1

void __thiscall cppcms::impl::cgi::http::async_read_some_headers(http *this,handler *h)

{
  pointer pcVar1;
  pointer pcVar2;
  callback *pcVar3;
  time_t tVar4;
  shared_ptr<cppcms::impl::cgi::http> ptr;
  undefined1 local_60 [24];
  intrusive_ptr<booster::callable<void_()>_> local_48;
  anon_class_24_2_de3467ba_for_func local_40;
  element_type *local_20;
  
  pcVar1 = (this->input_body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar2 = (this->input_body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pcVar1 == pcVar2) || ((long)pcVar1 - (long)pcVar2 == (ulong)this->input_body_ptr_)) {
    self((http *)&stack0xffffffffffffffd8);
    mfunc_to_event_handler<cppcms::impl::cgi::http,std::shared_ptr<cppcms::impl::cgi::http>,booster::callback<void(std::error_code_const&)>const&,booster::callback<void(std::error_code_const&)>>
              ((offset_in_http_to_subr)(local_60 + 0x10),(shared_ptr<cppcms::impl::cgi::http> *)0xe1
               ,(callback<void_(const_std::error_code_&)> *)0x0);
    local_60._0_8_ = local_60._16_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      booster::atomic_counter::inc();
    }
    booster::aio::basic_io_device::on_readable((callback *)&this->socket_);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)local_60);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)
               (local_60 + 0x10));
  }
  else {
    self((http *)local_60);
    pcVar3 = (callback *)booster::aio::basic_io_device::get_io_service();
    local_40.ptr.super___shared_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_60._0_8_;
    local_40.ptr.super___shared_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_;
    if ((element_type *)local_60._8_8_ != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(((enable_shared_from_this<cppcms::impl::cgi::connection> *)(local_60._8_8_ + 8))->
                 _M_weak_this).
                 super___weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = *(int *)&(((enable_shared_from_this<cppcms::impl::cgi::connection> *)
                         (local_60._8_8_ + 8))->_M_weak_this).
                        super___weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 1;
        UNLOCK();
      }
      else {
        *(int *)&(((enable_shared_from_this<cppcms::impl::cgi::connection> *)(local_60._8_8_ + 8))->
                 _M_weak_this).
                 super___weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = *(int *)&(((enable_shared_from_this<cppcms::impl::cgi::connection> *)
                         (local_60._8_8_ + 8))->_M_weak_this).
                        super___weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 1;
      }
    }
    local_40.h = (handler)(h->call_ptr).p_;
    if (local_40.h.call_ptr.p_ != (callable<void_(const_std::error_code_&)> *)0x0) {
      booster::atomic_counter::inc();
    }
    booster::callback<void()>::
    callback<cppcms::impl::cgi::http::async_read_some_headers(booster::callback<void(std::error_code_const&)>const&)::_lambda()_1_>
              ((callback<void()> *)&local_48,&local_40);
    booster::aio::io_service::post(pcVar3);
    booster::intrusive_ptr<booster::callable<void_()>_>::~intrusive_ptr(&local_48);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              (&local_40.h.call_ptr);
    local_20 = (element_type *)local_60._8_8_;
    if ((element_type *)
        local_40.ptr.super___shared_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.ptr.
                 super___shared_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
      local_20 = (element_type *)local_60._8_8_;
    }
  }
  if (local_20 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20);
  }
  tVar4 = time((time_t *)0x0);
  this->time_to_die_ = this->timeout_ + tVar4;
  return;
}

Assistant:

void async_read_some_headers(handler const &h)
		{
			if(!input_buffer_empty()) {
				auto ptr = self();
				socket_.get_io_service().post([=] {
					ptr->some_headers_data_read(booster::system::error_code(),h);
				});
			}
			else {
				socket_.on_readable(mfunc_to_event_handler(&http::some_headers_data_read,self(),h));
			}
			update_time();
		}